

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Optimisations.h
# Opt level: O0

void soul::Optimisations::recursivelyFlagStructUse(Type *type)

{
  bool bVar1;
  Structure *pSVar2;
  Type local_48;
  Member *local_30;
  Member *m;
  Member *__end4;
  Member *__begin4;
  ArrayWithPreallocation<soul::Structure::Member,_8UL> *__range4;
  Type *type_local;
  
  __range4 = (ArrayWithPreallocation<soul::Structure::Member,_8UL> *)type;
  bVar1 = Type::isStruct(type);
  if (bVar1) {
    pSVar2 = Type::getStructRef((Type *)__range4);
    if ((pSVar2->activeUseFlag & 1U) == 0) {
      pSVar2 = Type::getStructRef((Type *)__range4);
      pSVar2->activeUseFlag = true;
      pSVar2 = Type::getStructRef((Type *)__range4);
      __begin4 = (Member *)Structure::getMembers(pSVar2);
      __end4 = ArrayWithPreallocation<soul::Structure::Member,_8UL>::begin
                         ((ArrayWithPreallocation<soul::Structure::Member,_8UL> *)__begin4);
      m = ArrayWithPreallocation<soul::Structure::Member,_8UL>::end
                    ((ArrayWithPreallocation<soul::Structure::Member,_8UL> *)__begin4);
      for (; __end4 != m; __end4 = __end4 + 1) {
        local_30 = __end4;
        recursivelyFlagStructUse(&__end4->type);
      }
    }
  }
  else {
    bVar1 = Type::isArray((Type *)__range4);
    if (bVar1) {
      Type::getArrayElementType(&local_48,(Type *)__range4);
      recursivelyFlagStructUse(&local_48);
      Type::~Type(&local_48);
    }
  }
  return;
}

Assistant:

static void recursivelyFlagStructUse (const Type& type)
    {
        if (type.isStruct())
        {
            if (! type.getStructRef().activeUseFlag)
            {
                type.getStructRef().activeUseFlag = true;

                for (auto& m : type.getStructRef().getMembers())
                    recursivelyFlagStructUse (m.type);
            }
        }
        else if (type.isArray())
        {
            recursivelyFlagStructUse (type.getArrayElementType());
        }
    }